

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_case(CTcParser *this,int *err,CTPNStmSwitch *enclosing_switch)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *expr_00;
  CTPNStm *stm_00;
  CTPNStmSwitchBase *in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  CTPNStmCase *case_stm;
  CTPNStm *stm;
  CTcPrsNode *expr;
  int errnum;
  CTcTokenizer *this_00;
  CTcTokenizer *in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  errnum = (int)((ulong)in_RDI >> 0x20);
  CTcTokenizer::next(in_stack_ffffffffffffffb8);
  local_8 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x269f75);
  CTPNStmCase::CTPNStmCase((CTPNStmCase *)local_8);
  this_00 = local_8;
  expr_00 = parse_expr((CTcParser *)0x269f9a);
  if (expr_00 == (CTcPrsNode *)0x0) {
    *in_RSI = 1;
    local_8 = (CTcTokenizer *)0x0;
  }
  else {
    CTPNStmCaseBase::set_expr((CTPNStmCaseBase *)local_8,expr_00);
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x26a000);
    if (tVar1 == TOKT_COLON) {
      CTcTokenizer::next(in_stack_ffffffffffffffb8);
    }
    else {
      CTcTokenizer::log_error_curtok(this_00,errnum);
    }
    stm_00 = parse_stm((CTcParser *)enclosing_switch,(int *)expr,(CTPNStmSwitch *)stm,case_stm._4_4_
                      );
    CTPNStmCaseBase::set_stm((CTPNStmCaseBase *)local_8,stm_00);
    CTPNStmSwitchBase::inc_case_cnt(in_RDX);
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_case(int *err, CTPNStmSwitch *enclosing_switch)
{
    CTcPrsNode *expr;
    CTPNStm *stm;
    CTPNStmCase *case_stm;
    
    /* skip the 'case' keyword */
    G_tok->next();

    /* create the 'case' statement node */
    case_stm = new CTPNStmCase();

    /* parse the expression */
    expr = parse_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* store the expression in the case statement node */
    case_stm->set_expr(expr);

    /* require the colon */
    if (G_tok->cur() == TOKT_COLON)
    {
        /* skip the colon */
        G_tok->next();
    }
    else
    {
        /* log the error */
        G_tok->log_error_curtok(TCERR_REQ_CASE_COLON);
    }

    /* 
     *   parse the labeled statement - it's directly within this same
     *   enclosing switch, because a case label doesn't create a new
     *   expression nesting level (hence another 'case' label immediately
     *   following without an intervening statement is perfectly valid) 
     */
    stm = parse_stm(err, enclosing_switch, FALSE);

    /* set the statement in the case node */
    case_stm->set_stm(stm);

    /* count the 'case' label in the 'switch' node */
    enclosing_switch->inc_case_cnt();

    /* return the case node */
    return case_stm;
}